

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O0

int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj_00;
  int result;
  Abc_Ntk_t *pSatNtk;
  Vec_Ptr_t *vDelete;
  Abc_Obj_t *pInitObj;
  Abc_Obj_t *pObj;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(0);
  if (pManMR->pInitNtk == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x22f,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
  }
  if (pManMR->fSolutionIsDc == 0) {
    for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pManMR->pInitNtk->vObjs), pObj._4_4_ < iVar1;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pAVar3 = Abc_NtkObj(pManMR->pInitNtk,pObj._4_4_);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        iVar1 = Abc_ObjIsLatch(pAVar3);
        if (iVar1 != 0) {
          __assert_fail("!Abc_ObjIsLatch(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x23b,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
        iVar1 = Abc_ObjIsBo(pAVar3);
        if (iVar1 != 0) {
          __assert_fail("!Abc_ObjIsBo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x23c,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
        iVar1 = Abc_ObjIsBi(pAVar3);
        if (iVar1 != 0) {
          __assert_fail("!Abc_ObjIsBi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x23d,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
      }
    }
    while (iVar1 = Vec_PtrSize(p), iVar1 != 0) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrPop(p);
      Abc_NtkDeleteObj(pAVar3);
    }
    Vec_PtrFree(p);
    Abc_NtkAddDummyPoNames(pManMR->pInitNtk);
    Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
    iVar1 = Abc_NtkIsLogic(pManMR->pInitNtk);
    if (iVar1 != 0) {
      Abc_NtkCleanup(pManMR->pInitNtk,0);
    }
    if (pManMR->fVerbose != 0) {
      uVar2 = Abc_NtkObjNum(pManMR->pInitNtk);
      printf("\tsolving for init state (%d nodes)... ",(ulong)uVar2);
    }
    fflush(_stdout);
    iVar1 = Abc_NtkHasSop(pManMR->pInitNtk);
    if (iVar1 != 0) {
      Abc_NtkSopToBdd(pManMR->pInitNtk);
    }
    iVar1 = Abc_NtkHasAig(pManMR->pInitNtk);
    if (iVar1 != 0) {
      Abc_NtkAigToBdd(pManMR->pInitNtk);
    }
    iVar1 = Abc_NtkMiterSat(pManMR->pInitNtk,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0
                           );
    if (iVar1 == 0) {
      if (pManMR->fVerbose != 0) {
        printf("SUCCESS\n");
      }
      for (pObj._4_4_ = 0; iVar1 = Abc_NtkPiNum(pManMR->pInitNtk), pObj._4_4_ < iVar1;
          pObj._4_4_ = pObj._4_4_ + 1) {
        pAVar3 = Abc_NtkPi(pManMR->pInitNtk,pObj._4_4_);
        Abc_ObjSetCopy(pAVar3,(Abc_Obj_t *)0x0);
      }
      for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), pObj._4_4_ < iVar1;
          pObj._4_4_ = pObj._4_4_ + 1) {
        pAVar3 = Abc_NtkBox(pNtk,pObj._4_4_);
        iVar1 = Abc_ObjIsLatch(pAVar3);
        if (iVar1 != 0) {
          pObj_00 = (Abc_Obj_t *)Abc_ObjData(pAVar3);
          iVar1 = Abc_ObjIsPi(pObj_00);
          if (iVar1 == 0) {
            __assert_fail("Abc_ObjIsPi( pInitObj )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x272,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
          }
          Abc_ObjSetCopy(pObj_00,pAVar3);
          Abc_LatchSetInitNone(pAVar3);
        }
      }
      if (pManMR->pInitNtk->pModel == (int *)0x0) {
        __assert_fail("pManMR->pInitNtk->pModel",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x27b,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
      }
      for (pObj._4_4_ = 0; iVar1 = Abc_NtkPiNum(pManMR->pInitNtk), pObj._4_4_ < iVar1;
          pObj._4_4_ = pObj._4_4_ + 1) {
        pAVar3 = Abc_NtkPi(pManMR->pInitNtk,pObj._4_4_);
        pAVar3 = Abc_ObjCopy(pAVar3);
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          if (pManMR->pInitNtk->pModel[pObj._4_4_] == 0) {
            Abc_LatchSetInit0(pAVar3);
          }
          else {
            Abc_LatchSetInit1(pAVar3);
          }
        }
      }
      for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), pObj._4_4_ < iVar1;
          pObj._4_4_ = pObj._4_4_ + 1) {
        pAVar3 = Abc_NtkBox(pNtk,pObj._4_4_);
        iVar1 = Abc_ObjIsLatch(pAVar3);
        if ((iVar1 != 0) && (iVar1 = Abc_LatchIsInitNone(pAVar3), iVar1 != 0)) {
          __assert_fail("!Abc_LatchIsInitNone( pObj )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x287,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
        }
      }
      pNtk_local._4_4_ = 1;
    }
    else {
      if (pManMR->fVerbose != 0) {
        printf("FAILURE\n");
      }
      pNtk_local._4_4_ = 0;
    }
  }
  else {
    Vec_PtrFree(p);
    for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), pObj._4_4_ < iVar1;
        pObj._4_4_ = pObj._4_4_ + 1) {
      pAVar3 = Abc_NtkBox(pNtk,pObj._4_4_);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 != 0) {
        Abc_LatchSetInitDc(pAVar3);
      }
    }
    if (pManMR->fVerbose != 0) {
      printf("\tno init state computation: all-don\'t-care solution\n");
    }
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_FlowRetime_SolveBackwardInit( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj, *pInitObj;
  Vec_Ptr_t *vDelete = Vec_PtrAlloc(0);
  Abc_Ntk_t *pSatNtk;
  int result;

  assert(pManMR->pInitNtk);

  // is the solution entirely DC's?
  if (pManMR->fSolutionIsDc) {
    Vec_PtrFree(vDelete);
    Abc_NtkForEachLatch( pNtk, pObj, i ) Abc_LatchSetInitDc( pObj );
    vprintf("\tno init state computation: all-don't-care solution\n");
    return 1;
  }

  // check that network is combinational
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) {
    assert(!Abc_ObjIsLatch(pObj));
    assert(!Abc_ObjIsBo(pObj));
    assert(!Abc_ObjIsBi(pObj));
  }
  
  // delete superfluous nodes
  while(Vec_PtrSize( vDelete )) {
    pObj = (Abc_Obj_t *)Vec_PtrPop( vDelete );
    Abc_NtkDeleteObj( pObj );
  }
  Vec_PtrFree(vDelete);

  // do some final cleanup on the network
  Abc_NtkAddDummyPoNames(pManMR->pInitNtk);
  Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
  if (Abc_NtkIsLogic(pManMR->pInitNtk))
    Abc_NtkCleanup(pManMR->pInitNtk, 0);

#if defined(DEBUG_PRINT_INIT_NTK)
  Abc_NtkLevelReverse( pManMR->pInitNtk );
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) 
    if (Abc_ObjLevel( pObj ) < 2)
      Abc_ObjPrint(stdout, pObj);
#endif
  
  vprintf("\tsolving for init state (%d nodes)... ", Abc_NtkObjNum(pManMR->pInitNtk));
  fflush(stdout);
#ifdef ABC_USE_CUDD
  // convert SOPs to BDD
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToBdd( pManMR->pInitNtk );
  // convert AIGs to BDD
  if (Abc_NtkHasAig(pManMR->pInitNtk))
    Abc_NtkAigToBdd( pManMR->pInitNtk );
#else
  // convert SOPs to AIG
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToAig( pManMR->pInitNtk );
#endif
  pSatNtk = pManMR->pInitNtk;
  
  // solve
  result = Abc_NtkMiterSat( pSatNtk, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );

  if (!result) { 
    vprintf("SUCCESS\n");
  } else  {    
    vprintf("FAILURE\n");
    return 0;
  }

  // clear initial values, associate PIs to latches
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) Abc_ObjSetCopy( pInitObj, NULL );
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pInitObj = (Abc_Obj_t*)Abc_ObjData( pObj );
    assert( Abc_ObjIsPi( pInitObj ));
    Abc_ObjSetCopy( pInitObj, pObj );
    Abc_LatchSetInitNone( pObj );

    // DEBUG
    // printf("solve : getting latch %d from PI %d\n", pObj->Id, pInitObj->Id);
  }

  // copy solution from PIs to latches
  assert(pManMR->pInitNtk->pModel);
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) {
    if ((pObj = Abc_ObjCopy( pInitObj ))) {
      if ( pManMR->pInitNtk->pModel[i] )
        Abc_LatchSetInit1( pObj );
      else
        Abc_LatchSetInit0( pObj );
    }
  }

#if defined(DEBUG_CHECK)
  // check that all latches have initial state
  Abc_NtkForEachLatch( pNtk, pObj, i ) assert( !Abc_LatchIsInitNone( pObj ) );
#endif

  return 1;
}